

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O3

string * ToString<unsigned_short>
                   (string *__return_storage_ptr__,
                   basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                   *buf)

{
  utf16iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
  *__last;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar1;
  utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __result;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  bVar1.container =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(buf->_M_dataplus)._M_p;
  __last = (utf16iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
            *)((long)&((bVar1.container)->_M_dataplus)._M_p + buf->_M_string_length * 2);
  __result._p.container = bVar1.container;
  __result._0_8_ = __last;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<utf16iterator<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>>,utf8insert_iterator<std::back_insert_iterator<std::__cxx11::string>>>
            ((utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffffe0,
             (__copy_move<false,false,std::random_access_iterator_tag> *)&stack0xffffffffffffffd8,
             (utf16iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
              *)__return_storage_ptr__,__last,__result);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(const std::basic_string<T>& buf)
{
    std::string str;
    str.reserve(buf.size());
    std::copy(utfadaptor<sizeof(T)*8>::adapt(buf.begin()), utfadaptor<sizeof(T)*8>::adapt(buf.end()),
          utf8_backinserter(back_inserter(str)));
    return str;
}